

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

result __thiscall
fmt::v6::internal::fixed_handler::on_digit
          (fixed_handler *this,char digit,uint64_t divisor,uint64_t remainder,uint64_t error,
          int param_5,bool integral)

{
  int iVar1;
  char *pcVar2;
  round_direction rVar3;
  result rVar4;
  ulong uVar5;
  char *unaff_RBX;
  char *unaff_retaddr;
  
  if (divisor <= remainder) {
    assert_fail(unaff_retaddr,0,unaff_RBX);
  }
  iVar1 = this->size;
  this->size = iVar1 + 1;
  this->buf[iVar1] = digit;
  rVar4 = more;
  if (this->precision <= this->size) {
    if (integral) {
      if ((divisor < 3) || (error != 1)) {
        assert_fail(unaff_retaddr,0,unaff_RBX);
      }
    }
    else if (divisor <= error || divisor - error <= error) {
      return error;
    }
    rVar3 = get_round_direction(divisor,remainder,error);
    if (rVar3 == up) {
      this->buf[(long)this->size + -1] = this->buf[(long)this->size + -1] + '\x01';
      for (uVar5 = (ulong)(uint)this->size;
          (pcVar2 = this->buf, 1 < (int)uVar5 && ('9' < pcVar2[uVar5 - 1])); uVar5 = uVar5 - 1) {
        pcVar2[uVar5 - 1] = '0';
        this->buf[uVar5 - 2] = this->buf[uVar5 - 2] + '\x01';
      }
      rVar4 = done;
      if ('9' < *pcVar2) {
        *pcVar2 = '1';
        iVar1 = this->size;
        this->size = iVar1 + 1;
        this->buf[iVar1] = '0';
      }
    }
    else {
      rVar4 = (rVar3 != down) + done;
    }
  }
  return rVar4;
}

Assistant:

digits::result on_digit(char digit, uint64_t divisor, uint64_t remainder,
                          uint64_t error, int, bool integral) {
    FMT_ASSERT(remainder < divisor, "");
    buf[size++] = digit;
    if (size < precision) return digits::more;
    if (!integral) {
      // Check if error * 2 < divisor with overflow prevention.
      // The check is not needed for the integral part because error = 1
      // and divisor > (1 << 32) there.
      if (error >= divisor || error >= divisor - error) return digits::error;
    } else {
      FMT_ASSERT(error == 1 && divisor > 2, "");
    }
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir != round_direction::up)
      return dir == round_direction::down ? digits::done : digits::error;
    ++buf[size - 1];
    for (int i = size - 1; i > 0 && buf[i] > '9'; --i) {
      buf[i] = '0';
      ++buf[i - 1];
    }
    if (buf[0] > '9') {
      buf[0] = '1';
      buf[size++] = '0';
    }
    return digits::done;
  }